

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O3

void __thiscall
OpenMesh::BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,HPropHandleT<OpenMesh::Attributes::StatusInfo> *_ph,string *_name)

{
  pointer ppBVar1;
  BaseProperty *pBVar2;
  uint in_EAX;
  BasePropHandleT<OpenMesh::Attributes::StatusInfo> BVar3;
  int iVar4;
  undefined4 extraout_var;
  pointer ppBVar5;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  BVar3 = PropertyContainer::add<OpenMesh::Attributes::StatusInfo>
                    (&this->hprops_,(StatusInfo *)((long)&uStack_28 + 4),_name);
  (_ph->super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>).super_BaseHandle.idx_ =
       (int)BVar3.super_BaseHandle.idx_;
  iVar4 = (*this->_vptr_BaseKernel[3])(this);
  ppBVar1 = (this->hprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar5 = (this->hprops_).properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar5 != ppBVar1;
      ppBVar5 = ppBVar5 + 1) {
    pBVar2 = *ppBVar5;
    if (pBVar2 != (BaseProperty *)0x0) {
      (*pBVar2->_vptr_BaseProperty[3])(pBVar2,CONCAT44(extraout_var,iVar4));
    }
  }
  return;
}

Assistant:

void add_property( HPropHandleT<T>& _ph, const std::string& _name="<hprop>")
  {
    _ph = HPropHandleT<T>( hprops_.add(T(), _name) );
    hprops_.resize(n_halfedges());
  }